

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_os_symlink(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  char *ptr;
  char *__to;
  ulong uVar2;
  JSValueUnion JVar3;
  int64_t iVar4;
  JSValue JVar5;
  
  ptr = JS_ToCString(ctx,*argv);
  iVar4 = 6;
  if (ptr != (char *)0x0) {
    __to = JS_ToCString(ctx,argv[1]);
    if (__to != (char *)0x0) {
      iVar1 = symlink(ptr,__to);
      uVar2 = js_get_errno((long)iVar1);
      JS_FreeCString(ctx,ptr);
      JS_FreeCString(ctx,__to);
      JVar3.ptr = (void *)(uVar2 & 0xffffffff);
      iVar4 = 0;
      goto LAB_001114e1;
    }
    JS_FreeCString(ctx,ptr);
  }
  JVar3.float64 = 0.0;
LAB_001114e1:
  JVar5.tag = iVar4;
  JVar5.u.ptr = JVar3.ptr;
  return JVar5;
}

Assistant:

static JSValue js_os_symlink(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv)
{
    const char *target, *linkpath;
    int err;
    
    target = JS_ToCString(ctx, argv[0]);
    if (!target)
        return JS_EXCEPTION;
    linkpath = JS_ToCString(ctx, argv[1]);
    if (!linkpath) {
        JS_FreeCString(ctx, target);
        return JS_EXCEPTION;
    }
    err = js_get_errno(symlink(target, linkpath));
    JS_FreeCString(ctx, target);
    JS_FreeCString(ctx, linkpath);
    return JS_NewInt32(ctx, err);
}